

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray
          (GeneratedCodeInfo_Annotation *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint *puVar1;
  void *pvVar2;
  bool bVar3;
  uint8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint *puVar10;
  
  uVar9 = (this->_path_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar9) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    *target = 10;
    pbVar7 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar7;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar7 = target + 1;
        bVar3 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar3);
    }
    target = target + 2;
    *pbVar7 = (byte)uVar9;
    puVar10 = (uint *)(this->path_).arena_or_elements_;
    puVar1 = puVar10 + (this->path_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = *puVar10;
      if ((ulong)(long)(int)uVar9 < 0x80) {
        *target = (byte)uVar9;
        target = target + 1;
      }
      else {
        *target = (byte)uVar9 | 0x80;
        uVar5 = (ulong)(long)(int)uVar9 >> 7;
        if (uVar9 < 0x4000) {
          target[1] = (byte)uVar5;
          target = target + 2;
        }
        else {
          target = target + 2;
          do {
            pbVar7 = target;
            pbVar7[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            target = pbVar7 + 1;
            bVar3 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar3);
          *pbVar7 = (byte)uVar6;
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 < puVar1);
  }
  uVar9 = (this->_has_bits_).has_bits_[0];
  if ((uVar9 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(this->source_file_).ptr_,target);
  }
  if ((uVar9 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = this->begin_;
    *target = 0x18;
    if ((ulong)(long)(int)uVar8 < 0x80) {
      target[1] = (byte)uVar8;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      uVar5 = (ulong)(long)(int)uVar8 >> 7;
      if (uVar8 < 0x4000) {
        target[2] = (byte)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          pbVar7 = target;
          pbVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = pbVar7 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar3);
        *pbVar7 = (byte)uVar6;
      }
    }
  }
  if ((uVar9 & 4) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = this->end_;
    *target = 0x20;
    if ((ulong)(long)(int)uVar9 < 0x80) {
      target[1] = (byte)uVar9;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar9 | 0x80;
      uVar5 = (ulong)(long)(int)uVar9 >> 7;
      if (uVar9 < 0x4000) {
        target[2] = (byte)uVar5;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          pbVar7 = target;
          pbVar7[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          target = pbVar7 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar3);
        *pbVar7 = (byte)uVar6;
      }
    }
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* GeneratedCodeInfo_Annotation::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.GeneratedCodeInfo.Annotation)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = _path_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, _internal_path(), byte_size, target);
    }
  }

  cached_has_bits = _has_bits_[0];
  // optional string source_file = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_file().data(), static_cast<int>(this->_internal_source_file().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.GeneratedCodeInfo.Annotation.source_file");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_source_file(), target);
  }

  // optional int32 begin = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_begin(), target);
  }

  // optional int32 end = 4;
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(4, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.GeneratedCodeInfo.Annotation)
  return target;
}